

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall net_tests::cnetaddr_basic::test_method(cnetaddr_basic *this)

{
  long lVar1;
  DNSLookupFn dns_lookup_function;
  DNSLookupFn dns_lookup_function_00;
  DNSLookupFn dns_lookup_function_01;
  DNSLookupFn dns_lookup_function_02;
  DNSLookupFn dns_lookup_function_03;
  DNSLookupFn dns_lookup_function_04;
  DNSLookupFn dns_lookup_function_05;
  bool bVar2;
  readonly_property<bool> rVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator pvVar5;
  iterator in_R9;
  string *psVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  string_view str;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  undefined4 in_stack_fffffffffffff1e8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffff1ec;
  undefined4 uVar8;
  check_type cVar11;
  char *pcVar9;
  string *name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *__a;
  _Manager_type in_stack_fffffffffffff1f8;
  char *pcVar10;
  _Invoker_type in_stack_fffffffffffff200;
  undefined1 *local_df0;
  undefined1 *local_de8;
  char *local_de0;
  char *local_dd8;
  char *local_dd0;
  char *local_dc8;
  undefined1 *local_dc0;
  undefined1 *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  char *local_d98;
  undefined1 *local_d90;
  undefined1 *local_d88;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  char *local_d68;
  undefined1 *local_d60;
  undefined1 *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  char *local_d38;
  undefined1 *local_d30;
  undefined1 *local_d28;
  char *local_d20;
  char *local_d18;
  char *local_d10;
  char *local_d08;
  undefined1 *local_d00;
  undefined1 *local_cf8;
  char *local_cf0;
  char *local_ce8;
  char *local_ce0;
  char *local_cd8;
  undefined1 *local_cd0;
  undefined1 *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  char *local_ca8;
  undefined1 *local_ca0;
  undefined1 *local_c98;
  char *local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c78;
  undefined1 *local_c70;
  undefined1 *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  char *local_c48;
  undefined1 *local_c40;
  undefined1 *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  char *local_c18;
  undefined1 *local_c10;
  undefined1 *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  char *local_be8;
  undefined1 *local_be0;
  undefined1 *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  undefined1 *local_bb0;
  undefined1 *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  undefined1 *local_b80;
  undefined1 *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  undefined1 *local_b50;
  undefined1 *local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  undefined1 *local_b20;
  undefined1 *local_b18;
  char *local_b10;
  char *local_b08;
  char *local_b00;
  char *local_af8;
  undefined1 *local_af0;
  undefined1 *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  undefined1 *local_ac0;
  undefined1 *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  undefined1 *local_a90;
  undefined1 *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  undefined1 *local_a30;
  undefined1 *local_a28;
  char *local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  undefined1 *local_a00;
  undefined1 *local_9f8;
  char *local_9f0;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  undefined1 *local_9d0;
  undefined1 *local_9c8;
  char *local_9c0;
  char *local_9b8;
  char *local_9b0;
  char *local_9a8;
  undefined1 *local_9a0;
  undefined1 *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  undefined1 *local_940;
  undefined1 *local_938;
  char *local_930;
  char *local_928;
  char *local_920;
  char *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  undefined1 *local_8e0;
  undefined1 *local_8d8;
  char *local_8d0;
  char *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  allocator<char> local_879;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  char *torv3_addr;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  undefined1 *local_800;
  undefined1 *local_7f8;
  char *local_7f0;
  char *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_750;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_670;
  char *local_650;
  char *local_648;
  undefined1 *local_640;
  undefined1 *local_638;
  char *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_560;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_450;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_340;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_230;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_120;
  string local_100;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_d0;
  string scoped_addr;
  string link_local;
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  bool local_60;
  CNetAddr addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&link_local,"0.0.0.0",(allocator<char> *)&scoped_addr);
  std::
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  ::function(&local_120,&g_dns_lookup_abi_cxx11_);
  dns_lookup_function.super__Function_base._M_functor._4_4_ = in_stack_fffffffffffff1ec;
  dns_lookup_function.super__Function_base._M_functor._0_4_ = in_stack_fffffffffffff1e8;
  dns_lookup_function.super__Function_base._M_functor._8_8_ = (undefined8)_cVar11;
  dns_lookup_function.super__Function_base._M_manager = in_stack_fffffffffffff1f8;
  dns_lookup_function._M_invoker = in_stack_fffffffffffff200;
  LookupHost((optional<CNetAddr> *)local_80,&link_local,false,dns_lookup_function);
  if (local_60 == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    CNetAddr::operator=(&addr,(CNetAddr *)local_80);
    std::_Optional_payload_base<CNetAddr>::_M_reset((_Optional_payload_base<CNetAddr> *)local_80);
    std::_Function_base::~_Function_base(&local_120.super__Function_base);
    std::__cxx11::string::~string((string *)&link_local);
    local_130 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_128 = "";
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x8d;
    file.m_begin = (iterator)&local_130;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_140,msg);
    bVar2 = CNetAddr::IsValid(&addr);
    link_local._M_dataplus._M_p._0_1_ = !bVar2;
    link_local._M_string_length = 0;
    link_local.field_2._M_allocated_capacity = 0;
    scoped_addr._M_dataplus._M_p = "!addr.IsValid()";
    scoped_addr._M_string_length = (long)"!addr.IsValid()" + 0xf;
    local_80[8] = 0;
    local_80._0_8_ = &PTR__lazy_ostream_011481f0;
    local_70[0] = boost::unit_test::lazy_ostream::inst;
    local_150 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_148 = "";
    pvVar4 = (iterator)0x2;
    pvVar5 = (iterator)0x0;
    local_70[1] = (undefined1 *)&scoped_addr;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,_cVar11,
               (size_t)&local_150,0x8d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&link_local.field_2._M_allocated_capacity);
    local_160 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_158 = "";
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x8e;
    file_00.m_begin = (iterator)&local_160;
    msg_00.m_end = pvVar5;
    msg_00.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_170,
               msg_00);
    link_local._M_dataplus._M_p._0_1_ = addr.m_net == NET_IPV4;
    link_local._M_string_length = 0;
    link_local.field_2._M_allocated_capacity = 0;
    scoped_addr._M_dataplus._M_p = "addr.IsIPv4()";
    scoped_addr._M_string_length = (long)"addr.IsIPv4()" + 0xd;
    local_80[8] = 0;
    local_80._0_8_ = &PTR__lazy_ostream_011481f0;
    local_70[0] = boost::unit_test::lazy_ostream::inst;
    local_180 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_178 = "";
    pvVar4 = (iterator)0x2;
    pvVar5 = (iterator)0x0;
    local_70[1] = (undefined1 *)&scoped_addr;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,_cVar11,
               (size_t)&local_180,0x8e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&link_local.field_2._M_allocated_capacity);
    local_190 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_188 = "";
    local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x90;
    file_01.m_begin = (iterator)&local_190;
    msg_01.m_end = pvVar5;
    msg_01.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a0,
               msg_01);
    link_local._M_dataplus._M_p._0_1_ = CNetAddr::IsBindAny(&addr);
    link_local._M_string_length = 0;
    link_local.field_2._M_allocated_capacity = 0;
    scoped_addr._M_dataplus._M_p = "addr.IsBindAny()";
    scoped_addr._M_string_length = (long)"!addr.IsBindAny()" + 0x11;
    local_80[8] = 0;
    local_80._0_8_ = &PTR__lazy_ostream_011481f0;
    local_70[0] = boost::unit_test::lazy_ostream::inst;
    local_1b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_1a8 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    local_70[1] = (undefined1 *)&scoped_addr;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,_cVar11,
               (size_t)&local_1b0,0x90);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&link_local.field_2._M_allocated_capacity);
    local_1c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_1b8 = "";
    local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x91;
    file_02.m_begin = (iterator)&local_1c0;
    msg_02.m_end = pvVar5;
    msg_02.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1d0,
               msg_02);
    link_local._M_dataplus._M_p._0_1_ = CNetAddr::IsAddrV1Compatible(&addr);
    link_local._M_string_length = 0;
    link_local.field_2._M_allocated_capacity = 0;
    scoped_addr._M_dataplus._M_p = "addr.IsAddrV1Compatible()";
    scoped_addr._M_string_length = (long)"!addr.IsAddrV1Compatible()" + 0x1a;
    local_80[8] = 0;
    local_80._0_8_ = &PTR__lazy_ostream_011481f0;
    local_70[0] = boost::unit_test::lazy_ostream::inst;
    local_1e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_1d8 = "";
    pvVar4 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    local_70[1] = (undefined1 *)&scoped_addr;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,_cVar11,
               (size_t)&local_1e0,0x91);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&link_local.field_2._M_allocated_capacity);
    local_1f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_1e8 = "";
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x92;
    file_03.m_begin = (iterator)&local_1f0;
    msg_03.m_end = pvVar5;
    msg_03.m_begin = pvVar4;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_200,
               msg_03);
    local_80[8] = 0;
    local_80._0_8_ = &PTR__lazy_ostream_011480b0;
    local_70[0] = boost::unit_test::lazy_ostream::inst;
    local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
    local_210 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
    local_208 = "";
    CNetAddr::ToStringAddr_abi_cxx11_(&link_local,&addr);
    pcVar10 = "\"0.0.0.0\"";
    pcVar9 = "0.0.0.0";
    uVar7 = 0xbc8945;
    uVar8 = 0;
    pvVar4 = (iterator)0x2;
    psVar6 = &link_local;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_80,&local_210,0x92,1);
    std::__cxx11::string::~string((string *)&link_local);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&link_local,"255.255.255.255",(allocator<char> *)&scoped_addr);
    std::
    function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
    ::function(&local_230,&g_dns_lookup_abi_cxx11_);
    dns_lookup_function_00.super__Function_base._M_functor._4_4_ = uVar8;
    dns_lookup_function_00.super__Function_base._M_functor._0_4_ = uVar7;
    dns_lookup_function_00.super__Function_base._M_functor._8_8_ = pcVar9;
    dns_lookup_function_00.super__Function_base._M_manager = (_Manager_type)pcVar10;
    dns_lookup_function_00._M_invoker = in_stack_fffffffffffff200;
    LookupHost((optional<CNetAddr> *)local_80,&link_local,false,dns_lookup_function_00);
    if (local_60 == false) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        std::__throw_bad_optional_access();
      }
    }
    else {
      CNetAddr::operator=(&addr,(CNetAddr *)local_80);
      std::_Optional_payload_base<CNetAddr>::_M_reset((_Optional_payload_base<CNetAddr> *)local_80);
      std::_Function_base::~_Function_base(&local_230.super__Function_base);
      std::__cxx11::string::~string((string *)&link_local);
      local_240 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_238 = "";
      local_250 = &boost::unit_test::basic_cstring<char_const>::null;
      local_248 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x96;
      file_04.m_begin = (iterator)&local_240;
      msg_04.m_end = (iterator)psVar6;
      msg_04.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_250,
                 msg_04);
      bVar2 = CNetAddr::IsValid(&addr);
      link_local._M_dataplus._M_p._0_1_ = !bVar2;
      link_local._M_string_length = 0;
      link_local.field_2._M_allocated_capacity = 0;
      scoped_addr._M_dataplus._M_p = "!addr.IsValid()";
      scoped_addr._M_string_length = (long)"!addr.IsValid()" + 0xf;
      local_80[8] = 0;
      local_80._0_8_ = &PTR__lazy_ostream_011481f0;
      local_70[0] = boost::unit_test::lazy_ostream::inst;
      local_260 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_258 = "";
      pvVar4 = (iterator)0x2;
      pvVar5 = (iterator)0x0;
      local_70[1] = (undefined1 *)&scoped_addr;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,
                 (check_type)pcVar9,(size_t)&local_260,0x96);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&link_local.field_2._M_allocated_capacity);
      local_270 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_268 = "";
      local_280 = &boost::unit_test::basic_cstring<char_const>::null;
      local_278 = &boost::unit_test::basic_cstring<char_const>::null;
      file_05.m_end = (iterator)0x97;
      file_05.m_begin = (iterator)&local_270;
      msg_05.m_end = pvVar5;
      msg_05.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_280,
                 msg_05);
      link_local._M_dataplus._M_p._0_1_ = addr.m_net == NET_IPV4;
      link_local._M_string_length = 0;
      link_local.field_2._M_allocated_capacity = 0;
      scoped_addr._M_dataplus._M_p = "addr.IsIPv4()";
      scoped_addr._M_string_length = (long)"addr.IsIPv4()" + 0xd;
      local_80[8] = 0;
      local_80._0_8_ = &PTR__lazy_ostream_011481f0;
      local_70[0] = boost::unit_test::lazy_ostream::inst;
      local_290 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_288 = "";
      pvVar4 = (iterator)0x2;
      pvVar5 = (iterator)0x0;
      local_70[1] = (undefined1 *)&scoped_addr;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,
                 (check_type)pcVar9,(size_t)&local_290,0x97);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&link_local.field_2._M_allocated_capacity);
      local_2a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_298 = "";
      local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x99;
      file_06.m_begin = (iterator)&local_2a0;
      msg_06.m_end = pvVar5;
      msg_06.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2b0,
                 msg_06);
      bVar2 = CNetAddr::IsBindAny(&addr);
      link_local._M_dataplus._M_p._0_1_ = !bVar2;
      link_local._M_string_length = 0;
      link_local.field_2._M_allocated_capacity = 0;
      scoped_addr._M_dataplus._M_p = "!addr.IsBindAny()";
      scoped_addr._M_string_length = (long)"!addr.IsBindAny()" + 0x11;
      local_80[8] = 0;
      local_80._0_8_ = &PTR__lazy_ostream_011481f0;
      local_70[0] = boost::unit_test::lazy_ostream::inst;
      local_2c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_2b8 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      local_70[1] = (undefined1 *)&scoped_addr;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,
                 (check_type)pcVar9,(size_t)&local_2c0,0x99);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&link_local.field_2._M_allocated_capacity);
      local_2d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_2c8 = "";
      local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_07.m_end = (iterator)0x9a;
      file_07.m_begin = (iterator)&local_2d0;
      msg_07.m_end = pvVar5;
      msg_07.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2e0,
                 msg_07);
      link_local._M_dataplus._M_p._0_1_ = CNetAddr::IsAddrV1Compatible(&addr);
      link_local._M_string_length = 0;
      link_local.field_2._M_allocated_capacity = 0;
      scoped_addr._M_dataplus._M_p = "addr.IsAddrV1Compatible()";
      scoped_addr._M_string_length = (long)"!addr.IsAddrV1Compatible()" + 0x1a;
      local_80[8] = 0;
      local_80._0_8_ = &PTR__lazy_ostream_011481f0;
      local_70[0] = boost::unit_test::lazy_ostream::inst;
      local_2f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_2e8 = "";
      pvVar4 = &DAT_00000001;
      pvVar5 = (iterator)0x0;
      local_70[1] = (undefined1 *)&scoped_addr;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,
                 (check_type)pcVar9,(size_t)&local_2f0,0x9a);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&link_local.field_2._M_allocated_capacity);
      local_300 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_2f8 = "";
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      local_308 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0x9b;
      file_08.m_begin = (iterator)&local_300;
      msg_08.m_end = pvVar5;
      msg_08.m_begin = pvVar4;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_310,
                 msg_08);
      local_80[8] = 0;
      local_80._0_8_ = &PTR__lazy_ostream_011480b0;
      local_70[0] = boost::unit_test::lazy_ostream::inst;
      local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
      local_320 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
      local_318 = "";
      CNetAddr::ToStringAddr_abi_cxx11_(&link_local,&addr);
      pcVar10 = "\"255.255.255.255\"";
      pcVar9 = "255.255.255.255";
      uVar7 = 0xbc8945;
      uVar8 = 0;
      pvVar4 = (iterator)0x2;
      psVar6 = &link_local;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[16]>
                (local_80,&local_320,0x9b,1);
      std::__cxx11::string::~string((string *)&link_local);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&link_local,"12.34.56.78",(allocator<char> *)&scoped_addr);
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function(&local_340,&g_dns_lookup_abi_cxx11_);
      dns_lookup_function_01.super__Function_base._M_functor._4_4_ = uVar8;
      dns_lookup_function_01.super__Function_base._M_functor._0_4_ = uVar7;
      dns_lookup_function_01.super__Function_base._M_functor._8_8_ = pcVar9;
      dns_lookup_function_01.super__Function_base._M_manager = (_Manager_type)pcVar10;
      dns_lookup_function_01._M_invoker = in_stack_fffffffffffff200;
      LookupHost((optional<CNetAddr> *)local_80,&link_local,false,dns_lookup_function_01);
      if (local_60 == false) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          std::__throw_bad_optional_access();
        }
      }
      else {
        CNetAddr::operator=(&addr,(CNetAddr *)local_80);
        std::_Optional_payload_base<CNetAddr>::_M_reset
                  ((_Optional_payload_base<CNetAddr> *)local_80);
        std::_Function_base::~_Function_base(&local_340.super__Function_base);
        std::__cxx11::string::~string((string *)&link_local);
        local_350 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_348 = "";
        local_360 = &boost::unit_test::basic_cstring<char_const>::null;
        local_358 = &boost::unit_test::basic_cstring<char_const>::null;
        file_09.m_end = (iterator)0x9f;
        file_09.m_begin = (iterator)&local_350;
        msg_09.m_end = (iterator)psVar6;
        msg_09.m_begin = pvVar4;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_360
                   ,msg_09);
        link_local._M_dataplus._M_p._0_1_ = CNetAddr::IsValid(&addr);
        link_local._M_string_length = 0;
        link_local.field_2._M_allocated_capacity = 0;
        scoped_addr._M_dataplus._M_p = "addr.IsValid()";
        scoped_addr._M_string_length = (long)"!addr.IsValid()" + 0xf;
        local_80[8] = 0;
        local_80._0_8_ = &PTR__lazy_ostream_011481f0;
        local_70[0] = boost::unit_test::lazy_ostream::inst;
        local_370 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_368 = "";
        pvVar4 = (iterator)0x2;
        pvVar5 = (iterator)0x0;
        local_70[1] = (undefined1 *)&scoped_addr;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,
                   (check_type)pcVar9,(size_t)&local_370,0x9f);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&link_local.field_2._M_allocated_capacity);
        local_380 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_378 = "";
        local_390 = &boost::unit_test::basic_cstring<char_const>::null;
        local_388 = &boost::unit_test::basic_cstring<char_const>::null;
        file_10.m_end = (iterator)0xa0;
        file_10.m_begin = (iterator)&local_380;
        msg_10.m_end = pvVar5;
        msg_10.m_begin = pvVar4;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_390
                   ,msg_10);
        link_local._M_dataplus._M_p._0_1_ = addr.m_net == NET_IPV4;
        link_local._M_string_length = 0;
        link_local.field_2._M_allocated_capacity = 0;
        scoped_addr._M_dataplus._M_p = "addr.IsIPv4()";
        scoped_addr._M_string_length = (long)"addr.IsIPv4()" + 0xd;
        local_80[8] = 0;
        local_80._0_8_ = &PTR__lazy_ostream_011481f0;
        local_70[0] = boost::unit_test::lazy_ostream::inst;
        local_3a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_398 = "";
        pvVar4 = (iterator)0x2;
        pvVar5 = (iterator)0x0;
        local_70[1] = (undefined1 *)&scoped_addr;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,
                   (check_type)pcVar9,(size_t)&local_3a0,0xa0);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&link_local.field_2._M_allocated_capacity);
        local_3b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_3a8 = "";
        local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0xa2;
        file_11.m_begin = (iterator)&local_3b0;
        msg_11.m_end = pvVar5;
        msg_11.m_begin = pvVar4;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3c0
                   ,msg_11);
        bVar2 = CNetAddr::IsBindAny(&addr);
        link_local._M_dataplus._M_p._0_1_ = !bVar2;
        link_local._M_string_length = 0;
        link_local.field_2._M_allocated_capacity = 0;
        scoped_addr._M_dataplus._M_p = "!addr.IsBindAny()";
        scoped_addr._M_string_length = (long)"!addr.IsBindAny()" + 0x11;
        local_80[8] = 0;
        local_80._0_8_ = &PTR__lazy_ostream_011481f0;
        local_70[0] = boost::unit_test::lazy_ostream::inst;
        local_3d0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_3c8 = "";
        pvVar4 = &DAT_00000001;
        pvVar5 = (iterator)0x0;
        local_70[1] = (undefined1 *)&scoped_addr;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,
                   (check_type)pcVar9,(size_t)&local_3d0,0xa2);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&link_local.field_2._M_allocated_capacity);
        local_3e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_3d8 = "";
        local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_12.m_end = (iterator)0xa3;
        file_12.m_begin = (iterator)&local_3e0;
        msg_12.m_end = pvVar5;
        msg_12.m_begin = pvVar4;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3f0
                   ,msg_12);
        link_local._M_dataplus._M_p._0_1_ = CNetAddr::IsAddrV1Compatible(&addr);
        link_local._M_string_length = 0;
        link_local.field_2._M_allocated_capacity = 0;
        scoped_addr._M_dataplus._M_p = "addr.IsAddrV1Compatible()";
        scoped_addr._M_string_length = (long)"!addr.IsAddrV1Compatible()" + 0x1a;
        local_80[8] = 0;
        local_80._0_8_ = &PTR__lazy_ostream_011481f0;
        local_70[0] = boost::unit_test::lazy_ostream::inst;
        local_400 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_3f8 = "";
        pvVar4 = &DAT_00000001;
        pvVar5 = (iterator)0x0;
        local_70[1] = (undefined1 *)&scoped_addr;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,
                   (check_type)pcVar9,(size_t)&local_400,0xa3);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)&link_local.field_2._M_allocated_capacity);
        local_410 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_408 = "";
        local_420 = &boost::unit_test::basic_cstring<char_const>::null;
        local_418 = &boost::unit_test::basic_cstring<char_const>::null;
        file_13.m_end = (iterator)0xa4;
        file_13.m_begin = (iterator)&local_410;
        msg_13.m_end = pvVar5;
        msg_13.m_begin = pvVar4;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_420
                   ,msg_13);
        local_80[8] = 0;
        local_80._0_8_ = &PTR__lazy_ostream_011480b0;
        local_70[0] = boost::unit_test::lazy_ostream::inst;
        local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
        local_430 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
        ;
        local_428 = "";
        CNetAddr::ToStringAddr_abi_cxx11_(&link_local,&addr);
        pcVar10 = "\"12.34.56.78\"";
        pcVar9 = "12.34.56.78";
        uVar7 = 0xbc8945;
        uVar8 = 0;
        pvVar4 = (iterator)0x2;
        psVar6 = &link_local;
        boost::test_tools::tt_detail::
        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
                  (local_80,&local_430,0xa4,1);
        std::__cxx11::string::~string((string *)&link_local);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&link_local,"::",(allocator<char> *)&scoped_addr);
        std::
        function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
        ::function(&local_450,&g_dns_lookup_abi_cxx11_);
        dns_lookup_function_02.super__Function_base._M_functor._4_4_ = uVar8;
        dns_lookup_function_02.super__Function_base._M_functor._0_4_ = uVar7;
        dns_lookup_function_02.super__Function_base._M_functor._8_8_ = pcVar9;
        dns_lookup_function_02.super__Function_base._M_manager = (_Manager_type)pcVar10;
        dns_lookup_function_02._M_invoker = in_stack_fffffffffffff200;
        LookupHost((optional<CNetAddr> *)local_80,&link_local,false,dns_lookup_function_02);
        if (local_60 == false) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            std::__throw_bad_optional_access();
          }
        }
        else {
          CNetAddr::operator=(&addr,(CNetAddr *)local_80);
          std::_Optional_payload_base<CNetAddr>::_M_reset
                    ((_Optional_payload_base<CNetAddr> *)local_80);
          std::_Function_base::~_Function_base(&local_450.super__Function_base);
          std::__cxx11::string::~string((string *)&link_local);
          local_460 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_458 = "";
          local_470 = &boost::unit_test::basic_cstring<char_const>::null;
          local_468 = &boost::unit_test::basic_cstring<char_const>::null;
          file_14.m_end = (iterator)0xa8;
          file_14.m_begin = (iterator)&local_460;
          msg_14.m_end = (iterator)psVar6;
          msg_14.m_begin = pvVar4;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,
                     (size_t)&local_470,msg_14);
          bVar2 = CNetAddr::IsValid(&addr);
          link_local._M_dataplus._M_p._0_1_ = !bVar2;
          link_local._M_string_length = 0;
          link_local.field_2._M_allocated_capacity = 0;
          scoped_addr._M_dataplus._M_p = "!addr.IsValid()";
          scoped_addr._M_string_length = (long)"!addr.IsValid()" + 0xf;
          local_80[8] = 0;
          local_80._0_8_ = &PTR__lazy_ostream_011481f0;
          local_70[0] = boost::unit_test::lazy_ostream::inst;
          local_480 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_478 = "";
          pvVar4 = (iterator)0x2;
          pvVar5 = (iterator)0x0;
          local_70[1] = (undefined1 *)&scoped_addr;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,
                     (check_type)pcVar9,(size_t)&local_480,0xa8);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&link_local.field_2._M_allocated_capacity);
          local_490 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_488 = "";
          local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_498 = &boost::unit_test::basic_cstring<char_const>::null;
          file_15.m_end = (iterator)0xa9;
          file_15.m_begin = (iterator)&local_490;
          msg_15.m_end = pvVar5;
          msg_15.m_begin = pvVar4;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,
                     (size_t)&local_4a0,msg_15);
          link_local._M_dataplus._M_p._0_1_ = addr.m_net == NET_IPV6;
          link_local._M_string_length = 0;
          link_local.field_2._M_allocated_capacity = 0;
          scoped_addr._M_dataplus._M_p = "addr.IsIPv6()";
          scoped_addr._M_string_length = (long)"addr.IsIPv6()" + 0xd;
          local_80[8] = 0;
          local_80._0_8_ = &PTR__lazy_ostream_011481f0;
          local_70[0] = boost::unit_test::lazy_ostream::inst;
          local_4b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_4a8 = "";
          pvVar4 = (iterator)0x2;
          pvVar5 = (iterator)0x0;
          local_70[1] = (undefined1 *)&scoped_addr;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,
                     (check_type)pcVar9,(size_t)&local_4b0,0xa9);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&link_local.field_2._M_allocated_capacity);
          local_4c0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_4b8 = "";
          local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_16.m_end = (iterator)0xab;
          file_16.m_begin = (iterator)&local_4c0;
          msg_16.m_end = pvVar5;
          msg_16.m_begin = pvVar4;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,
                     (size_t)&local_4d0,msg_16);
          link_local._M_dataplus._M_p._0_1_ = CNetAddr::IsBindAny(&addr);
          link_local._M_string_length = 0;
          link_local.field_2._M_allocated_capacity = 0;
          scoped_addr._M_dataplus._M_p = "addr.IsBindAny()";
          scoped_addr._M_string_length = (long)"!addr.IsBindAny()" + 0x11;
          local_80[8] = 0;
          local_80._0_8_ = &PTR__lazy_ostream_011481f0;
          local_70[0] = boost::unit_test::lazy_ostream::inst;
          local_4e0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_4d8 = "";
          pvVar4 = &DAT_00000001;
          pvVar5 = (iterator)0x0;
          local_70[1] = (undefined1 *)&scoped_addr;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,
                     (check_type)pcVar9,(size_t)&local_4e0,0xab);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&link_local.field_2._M_allocated_capacity);
          local_4f0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_4e8 = "";
          local_500 = &boost::unit_test::basic_cstring<char_const>::null;
          local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_17.m_end = (iterator)0xac;
          file_17.m_begin = (iterator)&local_4f0;
          msg_17.m_end = pvVar5;
          msg_17.m_begin = pvVar4;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
                     (size_t)&local_500,msg_17);
          link_local._M_dataplus._M_p._0_1_ = CNetAddr::IsAddrV1Compatible(&addr);
          link_local._M_string_length = 0;
          link_local.field_2._M_allocated_capacity = 0;
          scoped_addr._M_dataplus._M_p = "addr.IsAddrV1Compatible()";
          scoped_addr._M_string_length = (long)"!addr.IsAddrV1Compatible()" + 0x1a;
          local_80[8] = 0;
          local_80._0_8_ = &PTR__lazy_ostream_011481f0;
          local_70[0] = boost::unit_test::lazy_ostream::inst;
          local_510 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_508 = "";
          pvVar4 = &DAT_00000001;
          pvVar5 = (iterator)0x0;
          local_70[1] = (undefined1 *)&scoped_addr;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,
                     (check_type)pcVar9,(size_t)&local_510,0xac);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&link_local.field_2._M_allocated_capacity);
          local_520 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_518 = "";
          local_530 = &boost::unit_test::basic_cstring<char_const>::null;
          local_528 = &boost::unit_test::basic_cstring<char_const>::null;
          file_18.m_end = (iterator)0xad;
          file_18.m_begin = (iterator)&local_520;
          msg_18.m_end = pvVar5;
          msg_18.m_begin = pvVar4;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,
                     (size_t)&local_530,msg_18);
          local_80[8] = 0;
          local_80._0_8_ = &PTR__lazy_ostream_011480b0;
          local_70[0] = boost::unit_test::lazy_ostream::inst;
          local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
          local_540 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
          ;
          local_538 = "";
          CNetAddr::ToStringAddr_abi_cxx11_(&link_local,&addr);
          pcVar10 = "\"::\"";
          pcVar9 = "::";
          uVar7 = 0xbc8945;
          uVar8 = 0;
          pvVar4 = (iterator)0x2;
          psVar6 = &link_local;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[3]>
                    (local_80,&local_540,0xad,1);
          std::__cxx11::string::~string((string *)&link_local);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&link_local,"1122:3344:5566:7788:9900:aabb:ccdd:eeff",
                     (allocator<char> *)&scoped_addr);
          std::
          function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
          ::function(&local_560,&g_dns_lookup_abi_cxx11_);
          dns_lookup_function_03.super__Function_base._M_functor._4_4_ = uVar8;
          dns_lookup_function_03.super__Function_base._M_functor._0_4_ = uVar7;
          dns_lookup_function_03.super__Function_base._M_functor._8_8_ = pcVar9;
          dns_lookup_function_03.super__Function_base._M_manager = (_Manager_type)pcVar10;
          dns_lookup_function_03._M_invoker = in_stack_fffffffffffff200;
          LookupHost((optional<CNetAddr> *)local_80,&link_local,false,dns_lookup_function_03);
          if (local_60 == false) {
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              std::__throw_bad_optional_access();
            }
          }
          else {
            CNetAddr::operator=(&addr,(CNetAddr *)local_80);
            std::_Optional_payload_base<CNetAddr>::_M_reset
                      ((_Optional_payload_base<CNetAddr> *)local_80);
            std::_Function_base::~_Function_base(&local_560.super__Function_base);
            std::__cxx11::string::~string((string *)&link_local);
            local_570 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_568 = "";
            local_580 = &boost::unit_test::basic_cstring<char_const>::null;
            local_578 = &boost::unit_test::basic_cstring<char_const>::null;
            file_19.m_end = (iterator)0xb1;
            file_19.m_begin = (iterator)&local_570;
            msg_19.m_end = (iterator)psVar6;
            msg_19.m_begin = pvVar4;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,
                       (size_t)&local_580,msg_19);
            link_local._M_dataplus._M_p._0_1_ = CNetAddr::IsValid(&addr);
            link_local._M_string_length = 0;
            link_local.field_2._M_allocated_capacity = 0;
            scoped_addr._M_dataplus._M_p = "addr.IsValid()";
            scoped_addr._M_string_length = (long)"!addr.IsValid()" + 0xf;
            local_80[8] = 0;
            local_80._0_8_ = &PTR__lazy_ostream_011481f0;
            local_70[0] = boost::unit_test::lazy_ostream::inst;
            local_590 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_588 = "";
            pvVar4 = (iterator)0x2;
            pvVar5 = (iterator)0x0;
            local_70[1] = (undefined1 *)&scoped_addr;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,
                       (check_type)pcVar9,(size_t)&local_590,0xb1);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&link_local.field_2._M_allocated_capacity);
            local_5a0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_598 = "";
            local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_20.m_end = (iterator)0xb2;
            file_20.m_begin = (iterator)&local_5a0;
            msg_20.m_end = pvVar5;
            msg_20.m_begin = pvVar4;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,
                       (size_t)&local_5b0,msg_20);
            link_local._M_dataplus._M_p._0_1_ = addr.m_net == NET_IPV6;
            link_local._M_string_length = 0;
            link_local.field_2._M_allocated_capacity = 0;
            scoped_addr._M_dataplus._M_p = "addr.IsIPv6()";
            scoped_addr._M_string_length = (long)"addr.IsIPv6()" + 0xd;
            local_80[8] = 0;
            local_80._0_8_ = &PTR__lazy_ostream_011481f0;
            local_70[0] = boost::unit_test::lazy_ostream::inst;
            local_5c0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_5b8 = "";
            pvVar4 = (iterator)0x2;
            pvVar5 = (iterator)0x0;
            local_70[1] = (undefined1 *)&scoped_addr;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&link_local,(lazy_ostream *)local_80,2,0,WARN,
                       (check_type)pcVar9,(size_t)&local_5c0,0xb2);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&link_local.field_2._M_allocated_capacity);
            local_5d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_5c8 = "";
            local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_21.m_end = (iterator)0xb4;
            file_21.m_begin = (iterator)&local_5d0;
            msg_21.m_end = pvVar5;
            msg_21.m_begin = pvVar4;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,
                       (size_t)&local_5e0,msg_21);
            bVar2 = CNetAddr::IsBindAny(&addr);
            link_local._M_dataplus._M_p._0_1_ = !bVar2;
            link_local._M_string_length = 0;
            link_local.field_2._M_allocated_capacity = 0;
            scoped_addr._M_dataplus._M_p = "!addr.IsBindAny()";
            scoped_addr._M_string_length = (long)"!addr.IsBindAny()" + 0x11;
            local_80[8] = 0;
            local_80._0_8_ = &PTR__lazy_ostream_011481f0;
            local_70[0] = boost::unit_test::lazy_ostream::inst;
            local_5f0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_5e8 = "";
            pvVar4 = &DAT_00000001;
            pvVar5 = (iterator)0x0;
            local_70[1] = (undefined1 *)&scoped_addr;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,
                       (check_type)pcVar9,(size_t)&local_5f0,0xb4);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&link_local.field_2._M_allocated_capacity);
            local_600 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_5f8 = "";
            local_610 = &boost::unit_test::basic_cstring<char_const>::null;
            local_608 = &boost::unit_test::basic_cstring<char_const>::null;
            file_22.m_end = (iterator)0xb5;
            file_22.m_begin = (iterator)&local_600;
            msg_22.m_end = pvVar5;
            msg_22.m_begin = pvVar4;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,
                       (size_t)&local_610,msg_22);
            link_local._M_dataplus._M_p._0_1_ = CNetAddr::IsAddrV1Compatible(&addr);
            link_local._M_string_length = 0;
            link_local.field_2._M_allocated_capacity = 0;
            scoped_addr._M_dataplus._M_p = "addr.IsAddrV1Compatible()";
            scoped_addr._M_string_length = (long)"!addr.IsAddrV1Compatible()" + 0x1a;
            local_80[8] = 0;
            local_80._0_8_ = &PTR__lazy_ostream_011481f0;
            local_70[0] = boost::unit_test::lazy_ostream::inst;
            local_620 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_618 = "";
            pvVar4 = &DAT_00000001;
            pvVar5 = (iterator)0x0;
            local_70[1] = (undefined1 *)&scoped_addr;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&link_local,(lazy_ostream *)local_80,1,0,WARN,
                       (check_type)pcVar9,(size_t)&local_620,0xb5);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)&link_local.field_2._M_allocated_capacity);
            local_630 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_628 = "";
            local_640 = &boost::unit_test::basic_cstring<char_const>::null;
            local_638 = &boost::unit_test::basic_cstring<char_const>::null;
            file_23.m_end = (iterator)0xb6;
            file_23.m_begin = (iterator)&local_630;
            msg_23.m_end = pvVar5;
            msg_23.m_begin = pvVar4;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,
                       (size_t)&local_640,msg_23);
            local_80[8] = 0;
            local_80._0_8_ = &PTR__lazy_ostream_011480b0;
            local_70[0] = boost::unit_test::lazy_ostream::inst;
            local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
            local_650 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
            ;
            local_648 = "";
            CNetAddr::ToStringAddr_abi_cxx11_(&link_local,&addr);
            pcVar10 = "\"1122:3344:5566:7788:9900:aabb:ccdd:eeff\"";
            pcVar9 = "1122:3344:5566:7788:9900:aabb:ccdd:eeff";
            uVar7 = 0xbc8945;
            uVar8 = 0;
            pvVar4 = (iterator)0x2;
            psVar6 = &link_local;
            boost::test_tools::tt_detail::
            check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[40]>
                      (local_80,&local_650,0xb6,1);
            std::__cxx11::string::~string((string *)&link_local);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&link_local,"fe80::1",(allocator<char> *)local_80);
            std::operator+(&scoped_addr,&link_local,"%32");
            std::
            function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
            ::function(&local_670,&g_dns_lookup_abi_cxx11_);
            name = &scoped_addr;
            dns_lookup_function_04.super__Function_base._M_functor._4_4_ = uVar8;
            dns_lookup_function_04.super__Function_base._M_functor._0_4_ = uVar7;
            dns_lookup_function_04.super__Function_base._M_functor._8_8_ = pcVar9;
            dns_lookup_function_04.super__Function_base._M_manager = (_Manager_type)pcVar10;
            dns_lookup_function_04._M_invoker = in_stack_fffffffffffff200;
            LookupHost((optional<CNetAddr> *)local_80,name,false,dns_lookup_function_04);
            if (local_60 == false) {
              if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                std::__throw_bad_optional_access();
              }
            }
            else {
              CNetAddr::operator=(&addr,(CNetAddr *)local_80);
              std::_Optional_payload_base<CNetAddr>::_M_reset
                        ((_Optional_payload_base<CNetAddr> *)local_80);
              std::_Function_base::~_Function_base(&local_670.super__Function_base);
              local_680 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_678 = "";
              local_690 = &boost::unit_test::basic_cstring<char_const>::null;
              local_688 = &boost::unit_test::basic_cstring<char_const>::null;
              file_24.m_end = (iterator)0xc0;
              file_24.m_begin = (iterator)&local_680;
              msg_24.m_end = (iterator)psVar6;
              msg_24.m_begin = pvVar4;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,
                         (size_t)&local_690,msg_24);
              rVar3.super_class_property<bool>.value =
                   (class_property<bool>)CNetAddr::IsValid(&addr);
              local_e0._8_8_ = (element_type *)0x0;
              aStack_d0._M_allocated_capacity = 0;
              local_100._M_dataplus._M_p = "addr.IsValid()";
              local_100._M_string_length = 0xbc4055;
              local_80[8] = 0;
              local_80._0_8_ = &PTR__lazy_ostream_011481f0;
              local_70[0] = boost::unit_test::lazy_ostream::inst;
              local_6a0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_698 = "";
              pvVar4 = (iterator)0x2;
              pvVar5 = (iterator)0x0;
              local_70[1] = (undefined1 *)&local_100;
              local_e0[0] = rVar3.super_class_property<bool>.value;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                         (check_type)pcVar9,(size_t)&local_6a0,0xc0);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_d0._M_allocated_capacity);
              local_6b0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_6a8 = "";
              local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
              file_25.m_end = (iterator)0xc1;
              file_25.m_begin = (iterator)&local_6b0;
              msg_25.m_end = pvVar5;
              msg_25.m_begin = pvVar4;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,
                         (size_t)&local_6c0,msg_25);
              local_e0[0] = (class_property<bool>)(addr.m_net == NET_IPV6);
              local_e0._8_8_ = (element_type *)0x0;
              aStack_d0._M_allocated_capacity = 0;
              local_100._M_dataplus._M_p = "addr.IsIPv6()";
              local_100._M_string_length = 0xbc40b9;
              local_80[8] = 0;
              local_80._0_8_ = &PTR__lazy_ostream_011481f0;
              local_70[0] = boost::unit_test::lazy_ostream::inst;
              local_6d0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_6c8 = "";
              pvVar4 = (iterator)0x2;
              pvVar5 = (iterator)0x0;
              local_70[1] = (undefined1 *)&local_100;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                         (check_type)pcVar9,(size_t)&local_6d0,0xc1);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_d0._M_allocated_capacity);
              local_6e0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_6d8 = "";
              local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
              file_26.m_end = (iterator)0xc2;
              file_26.m_begin = (iterator)&local_6e0;
              msg_26.m_end = pvVar5;
              msg_26.m_begin = pvVar4;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,
                         (size_t)&local_6f0,msg_26);
              bVar2 = CNetAddr::IsBindAny(&addr);
              local_e0[0] = (class_property<bool>)(class_property<bool>)!bVar2;
              local_e0._8_8_ = (element_type *)0x0;
              aStack_d0._M_allocated_capacity = 0;
              local_100._M_dataplus._M_p = "!addr.IsBindAny()";
              local_100._M_string_length = 0xbc407f;
              local_80[8] = 0;
              local_80._0_8_ = &PTR__lazy_ostream_011481f0;
              local_70[0] = boost::unit_test::lazy_ostream::inst;
              local_700 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_6f8 = "";
              pvVar4 = &DAT_00000001;
              pvVar5 = (iterator)0x0;
              local_70[1] = (undefined1 *)&local_100;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                         (check_type)pcVar9,(size_t)&local_700,0xc2);
              boost::detail::shared_count::~shared_count
                        ((shared_count *)&aStack_d0._M_allocated_capacity);
              local_710 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_708 = "";
              local_720 = &boost::unit_test::basic_cstring<char_const>::null;
              local_718 = &boost::unit_test::basic_cstring<char_const>::null;
              file_27.m_end = (iterator)0xc3;
              file_27.m_begin = (iterator)&local_710;
              msg_27.m_end = pvVar5;
              msg_27.m_begin = pvVar4;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,
                         (size_t)&local_720,msg_27);
              local_80[8] = 0;
              local_80._0_8_ = &PTR__lazy_ostream_011480b0;
              local_70[0] = boost::unit_test::lazy_ostream::inst;
              local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
              local_730 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
              ;
              local_728 = "";
              CNetAddr::ToStringAddr_abi_cxx11_((string *)local_e0,&addr);
              pcVar9 = "scoped_addr";
              uVar7 = 0xbc8945;
              uVar8 = 0;
              pvVar5 = (iterator)0x2;
              pvVar4 = local_e0;
              boost::test_tools::tt_detail::
              check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                        (local_80,&local_730,0xc3,1);
              std::__cxx11::string::~string((string *)local_e0);
              __lhs = &link_local;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0,__lhs,"%0");
              std::
              function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
              ::function(&local_750,&g_dns_lookup_abi_cxx11_);
              dns_lookup_function_05.super__Function_base._M_functor._4_4_ = uVar8;
              dns_lookup_function_05.super__Function_base._M_functor._0_4_ = uVar7;
              dns_lookup_function_05.super__Function_base._M_functor._8_8_ = name;
              dns_lookup_function_05.super__Function_base._M_manager = (_Manager_type)pcVar9;
              dns_lookup_function_05._M_invoker = in_stack_fffffffffffff200;
              LookupHost((optional<CNetAddr> *)local_80,(string *)local_e0,false,
                         dns_lookup_function_05);
              if (local_60 == false) {
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                  std::__throw_bad_optional_access();
                }
              }
              else {
                CNetAddr::operator=(&addr,(CNetAddr *)local_80);
                std::_Optional_payload_base<CNetAddr>::_M_reset
                          ((_Optional_payload_base<CNetAddr> *)local_80);
                std::_Function_base::~_Function_base(&local_750.super__Function_base);
                std::__cxx11::string::~string((string *)local_e0);
                local_760 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_758 = "";
                local_770 = &boost::unit_test::basic_cstring<char_const>::null;
                local_768 = &boost::unit_test::basic_cstring<char_const>::null;
                file_28.m_end = (iterator)0xc7;
                file_28.m_begin = (iterator)&local_760;
                msg_28.m_end = pvVar4;
                msg_28.m_begin = pvVar5;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,
                           (size_t)&local_770,msg_28);
                rVar3.super_class_property<bool>.value =
                     (class_property<bool>)CNetAddr::IsValid(&addr);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "addr.IsValid()";
                local_100._M_string_length = 0xbc4055;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_780 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_778 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                local_e0[0] = rVar3.super_class_property<bool>.value;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                           (check_type)name,(size_t)&local_780,199);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_790 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_788 = "";
                local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_798 = &boost::unit_test::basic_cstring<char_const>::null;
                file_29.m_end = (iterator)0xc8;
                file_29.m_begin = (iterator)&local_790;
                msg_29.m_end = pvVar5;
                msg_29.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,
                           (size_t)&local_7a0,msg_29);
                local_e0[0] = (class_property<bool>)(addr.m_net == NET_IPV6);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "addr.IsIPv6()";
                local_100._M_string_length = 0xbc40b9;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_7b0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_7a8 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                           (check_type)name,(size_t)&local_7b0,200);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_7c0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_7b8 = "";
                local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_30.m_end = (iterator)0xc9;
                file_30.m_begin = (iterator)&local_7c0;
                msg_30.m_end = pvVar5;
                msg_30.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                           (size_t)&local_7d0,msg_30);
                bVar2 = CNetAddr::IsBindAny(&addr);
                local_e0[0] = (class_property<bool>)(class_property<bool>)!bVar2;
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "!addr.IsBindAny()";
                local_100._M_string_length = 0xbc407f;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_7e0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_7d8 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                           (check_type)name,(size_t)&local_7e0,0xc9);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_7f0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_7e8 = "";
                local_800 = &boost::unit_test::basic_cstring<char_const>::null;
                local_7f8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_31.m_end = (iterator)0xca;
                file_31.m_begin = (iterator)&local_7f0;
                msg_31.m_end = pvVar5;
                msg_31.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,
                           (size_t)&local_800,msg_31);
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011480b0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
                local_810 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_808 = "";
                CNetAddr::ToStringAddr_abi_cxx11_((string *)local_e0,&addr);
                pvVar5 = (iterator)0x2;
                pvVar4 = local_e0;
                boost::test_tools::tt_detail::
                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                          (local_80,&local_810,0xca,1,2,pvVar4,0xbc8945,__lhs,"link_local");
                std::__cxx11::string::~string((string *)local_e0);
                local_820 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_818 = "";
                local_830 = &boost::unit_test::basic_cstring<char_const>::null;
                local_828 = &boost::unit_test::basic_cstring<char_const>::null;
                file_32.m_end = (iterator)0xcd;
                file_32.m_begin = (iterator)&local_820;
                msg_32.m_end = pvVar4;
                msg_32.m_begin = pvVar5;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,
                           (size_t)&local_830,msg_32);
                __a = (allocator<char> *)&torv3_addr;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,"6hzph5hv6337r6p2.onion",__a);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = "!addr.SetSpecial(\"6hzph5hv6337r6p2.onion\")";
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_850 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_848 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)__lhs,(size_t)&local_850,0xcd);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                torv3_addr = "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion";
                local_868 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_860 = "";
                local_878 = &boost::unit_test::basic_cstring<char_const>::null;
                local_870 = &boost::unit_test::basic_cstring<char_const>::null;
                file_33.m_end = (iterator)0xd1;
                file_33.m_begin = (iterator)&local_868;
                msg_33.m_end = pvVar5;
                msg_33.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,
                           (size_t)&local_878,msg_33);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,torv3_addr,&local_879);
                local_100._M_dataplus._M_p._0_1_ = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = "addr.SetSpecial(torv3_addr)";
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_890 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_888 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,2,0,WARN,
                           (check_type)__lhs,(size_t)&local_890,0xd1);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_8a0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_898 = "";
                local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_34.m_end = (iterator)0xd2;
                file_34.m_begin = (iterator)&local_8a0;
                msg_34.m_end = pvVar5;
                msg_34.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,
                           (size_t)&local_8b0,msg_34);
                rVar3.super_class_property<bool>.value =
                     (class_property<bool>)CNetAddr::IsValid(&addr);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "addr.IsValid()";
                local_100._M_string_length = 0xbc4055;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_8c0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_8b8 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                local_e0[0] = rVar3.super_class_property<bool>.value;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                           (check_type)__lhs,(size_t)&local_8c0,0xd2);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_8d0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_8c8 = "";
                local_8e0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_8d8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_35.m_end = (iterator)0xd3;
                file_35.m_begin = (iterator)&local_8d0;
                msg_35.m_end = pvVar5;
                msg_35.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,
                           (size_t)&local_8e0,msg_35);
                local_e0[0] = (class_property<bool>)(addr.m_net == NET_ONION);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "addr.IsTor()";
                local_100._M_string_length = 0xbc43fc;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_8f0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_8e8 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                           (check_type)__lhs,(size_t)&local_8f0,0xd3);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_900 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_8f8 = "";
                local_910 = &boost::unit_test::basic_cstring<char_const>::null;
                local_908 = &boost::unit_test::basic_cstring<char_const>::null;
                file_36.m_end = (iterator)0xd5;
                file_36.m_begin = (iterator)&local_900;
                msg_36.m_end = pvVar5;
                msg_36.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,
                           (size_t)&local_910,msg_36);
                local_e0[0] = (class_property<bool>)(addr.m_net != NET_I2P);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "!addr.IsI2P()";
                local_100._M_string_length = 0xbc41a2;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_920 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_918 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                           (check_type)__lhs,(size_t)&local_920,0xd5);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_930 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_928 = "";
                local_940 = &boost::unit_test::basic_cstring<char_const>::null;
                local_938 = &boost::unit_test::basic_cstring<char_const>::null;
                file_37.m_end = (iterator)0xd6;
                file_37.m_begin = (iterator)&local_930;
                msg_37.m_end = pvVar5;
                msg_37.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,
                           (size_t)&local_940,msg_37);
                bVar2 = CNetAddr::IsBindAny(&addr);
                local_e0[0] = (class_property<bool>)!bVar2;
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "!addr.IsBindAny()";
                local_100._M_string_length = 0xbc407f;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_950 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_948 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                           (check_type)__lhs,(size_t)&local_950,0xd6);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_960 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_958 = "";
                local_970 = &boost::unit_test::basic_cstring<char_const>::null;
                local_968 = &boost::unit_test::basic_cstring<char_const>::null;
                file_38.m_end = (iterator)0xd7;
                file_38.m_begin = (iterator)&local_960;
                msg_38.m_end = pvVar5;
                msg_38.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,
                           (size_t)&local_970,msg_38);
                bVar2 = CNetAddr::IsAddrV1Compatible(&addr);
                local_e0[0] = (class_property<bool>)(class_property<bool>)!bVar2;
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "!addr.IsAddrV1Compatible()";
                local_100._M_string_length = 0xbc41bd;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_980 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_978 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                           (check_type)__lhs,(size_t)&local_980,0xd7);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_990 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_988 = "";
                local_9a0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_998 = &boost::unit_test::basic_cstring<char_const>::null;
                file_39.m_end = (iterator)0xd8;
                file_39.m_begin = (iterator)&local_990;
                msg_39.m_end = pvVar5;
                msg_39.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,
                           (size_t)&local_9a0,msg_39);
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011480b0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
                local_9b0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_9a8 = "";
                CNetAddr::ToStringAddr_abi_cxx11_((string *)local_e0,&addr);
                pvVar5 = (iterator)0x2;
                pvVar4 = local_e0;
                boost::test_tools::tt_detail::
                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char_const*>
                          (local_80,&local_9b0,0xd8,1,2,pvVar4,0xbc8945,__a,"torv3_addr");
                std::__cxx11::string::~string((string *)local_e0);
                local_9c0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_9b8 = "";
                local_9d0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_9c8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_40.m_end = (iterator)0xdb;
                file_40.m_begin = (iterator)&local_9c0;
                msg_40.m_end = pvVar4;
                msg_40.m_begin = pvVar5;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,
                           (size_t)&local_9d0,msg_40);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,
                           "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.onion",
                           &local_879);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = 
                "!addr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.onion\")"
                ;
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_9e0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_9d8 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)__a,(size_t)&local_9e0,0xdb);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_9f0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_9e8 = "";
                local_a00 = &boost::unit_test::basic_cstring<char_const>::null;
                local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_41.m_end = (iterator)0xde;
                file_41.m_begin = (iterator)&local_9f0;
                msg_41.m_end = pvVar5;
                msg_41.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,
                           (size_t)&local_a00,msg_41);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,
                           "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscrye.onion",
                           &local_879);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = 
                "!addr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscrye.onion\")"
                ;
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_a10 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a08 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)__a,(size_t)&local_a10,0xde);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_a20 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a18 = "";
                local_a30 = &boost::unit_test::basic_cstring<char_const>::null;
                local_a28 = &boost::unit_test::basic_cstring<char_const>::null;
                file_42.m_end = (iterator)0xe2;
                file_42.m_begin = (iterator)&local_a20;
                msg_42.m_end = pvVar5;
                msg_42.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,
                           (size_t)&local_a30,msg_42);
                local_80._0_8_ = local_70;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_80,
                           "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd","");
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = 
                "!addr.SetSpecial(std::string{ \"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd\\0wtf.onion\", 66})"
                ;
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_a40 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a38 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)__a,(size_t)&local_a40,0xe2);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_a50 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a48 = "";
                local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
                local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
                file_43.m_end = (iterator)0xe5;
                file_43.m_begin = (iterator)&local_a50;
                msg_43.m_end = pvVar5;
                msg_43.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,
                           (size_t)&local_a60,msg_43);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,"mfrggzak.onion",&local_879);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = "!addr.SetSpecial(std::string{\"mfrggzak.onion\"})";
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_a70 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a68 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)__a,(size_t)&local_a70,0xe5);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_a80 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a78 = "";
                local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
                local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
                file_44.m_end = (iterator)0xe8;
                file_44.m_begin = (iterator)&local_a80;
                msg_44.m_end = pvVar5;
                msg_44.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,
                           (size_t)&local_a90,msg_44);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,"mf*g zak.onion",&local_879);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = "!addr.SetSpecial(std::string{\"mf*g zak.onion\"})";
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_aa0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_a98 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)__a,(size_t)&local_aa0,0xe8);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_ab0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_aa8 = "";
                local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_45.m_end = (iterator)0xec;
                file_45.m_begin = (iterator)&local_ab0;
                msg_45.m_end = pvVar5;
                msg_45.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,
                           (size_t)&local_ac0,msg_45);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,
                           "UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P",&local_879
                          );
                local_100._M_dataplus._M_p._0_1_ = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = "addr.SetSpecial(i2p_addr)";
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_ad0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ac8 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,2,0,WARN,
                           (check_type)__a,(size_t)&local_ad0,0xec);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_ae0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ad8 = "";
                local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_ae8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_46.m_end = (iterator)0xed;
                file_46.m_begin = (iterator)&local_ae0;
                msg_46.m_end = pvVar5;
                msg_46.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,
                           (size_t)&local_af0,msg_46);
                rVar3.super_class_property<bool>.value =
                     (class_property<bool>)CNetAddr::IsValid(&addr);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "addr.IsValid()";
                local_100._M_string_length = 0xbc4055;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_b00 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_af8 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                local_e0[0] = rVar3.super_class_property<bool>.value;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                           (check_type)__a,(size_t)&local_b00,0xed);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_b10 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b08 = "";
                local_b20 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
                file_47.m_end = (iterator)0xee;
                file_47.m_begin = (iterator)&local_b10;
                msg_47.m_end = pvVar5;
                msg_47.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,
                           (size_t)&local_b20,msg_47);
                local_e0[0] = (class_property<bool>)(addr.m_net == NET_I2P);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "addr.IsI2P()";
                local_100._M_string_length = 0xbc41a2;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_b30 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b28 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                           (check_type)__a,(size_t)&local_b30,0xee);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_b40 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b38 = "";
                local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
                file_48.m_end = (iterator)0xf0;
                file_48.m_begin = (iterator)&local_b40;
                msg_48.m_end = pvVar5;
                msg_48.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,
                           (size_t)&local_b50,msg_48);
                local_e0[0] = (class_property<bool>)(addr.m_net != NET_ONION);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "!addr.IsTor()";
                local_100._M_string_length = 0xbc43fc;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_b60 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b58 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                           (check_type)__a,(size_t)&local_b60,0xf0);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_b70 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b68 = "";
                local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
                local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
                file_49.m_end = (iterator)0xf1;
                file_49.m_begin = (iterator)&local_b70;
                msg_49.m_end = pvVar5;
                msg_49.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,
                           (size_t)&local_b80,msg_49);
                bVar2 = CNetAddr::IsBindAny(&addr);
                local_e0[0] = (class_property<bool>)!bVar2;
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "!addr.IsBindAny()";
                local_100._M_string_length = 0xbc407f;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_b90 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b88 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                           (check_type)__a,(size_t)&local_b90,0xf1);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_ba0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_b98 = "";
                local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_50.m_end = (iterator)0xf2;
                file_50.m_begin = (iterator)&local_ba0;
                msg_50.m_end = pvVar5;
                msg_50.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,
                           (size_t)&local_bb0,msg_50);
                bVar2 = CNetAddr::IsAddrV1Compatible(&addr);
                local_e0[0] = (class_property<bool>)(class_property<bool>)!bVar2;
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "!addr.IsAddrV1Compatible()";
                local_100._M_string_length = 0xbc41bd;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_bc0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_bb8 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                           (check_type)__a,(size_t)&local_bc0,0xf2);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_bd0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_bc8 = "";
                local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_51.m_end = (iterator)0xf3;
                file_51.m_begin = (iterator)&local_bd0;
                msg_51.m_end = pvVar5;
                msg_51.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,
                           (size_t)&local_be0,msg_51);
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011480b0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
                local_bf0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_be8 = "";
                CNetAddr::ToStringAddr_abi_cxx11_((string *)local_e0,&addr);
                psVar6 = &local_100;
                str._M_str = "UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P";
                str._M_len = 0x3c;
                ToLower_abi_cxx11_(psVar6,str);
                pvVar5 = (iterator)0x2;
                pvVar4 = local_e0;
                boost::test_tools::tt_detail::
                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                          (local_80,&local_bf0,0xf3,1,2,pvVar4,0xbc8945,psVar6,"ToLower(i2p_addr)");
                std::__cxx11::string::~string((string *)&local_100);
                std::__cxx11::string::~string((string *)local_e0);
                local_c00 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_bf8 = "";
                local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
                local_c08 = &boost::unit_test::basic_cstring<char_const>::null;
                file_52.m_end = (iterator)0xf6;
                file_52.m_begin = (iterator)&local_c00;
                msg_52.m_end = pvVar4;
                msg_52.m_begin = pvVar5;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,
                           (size_t)&local_c10,msg_52);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,
                           "udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jn=.b32.i2p",&local_879
                          );
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = 
                "!addr.SetSpecial(\"udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jn=.b32.i2p\")"
                ;
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_c20 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c18 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)psVar6,(size_t)&local_c20,0xf6);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_c30 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c28 = "";
                local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
                local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
                file_53.m_end = (iterator)0xf9;
                file_53.m_begin = (iterator)&local_c30;
                msg_53.m_end = pvVar5;
                msg_53.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,
                           (size_t)&local_c40,msg_53);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,
                           "udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna=.b32.i2p",
                           &local_879);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = 
                "!addr.SetSpecial(\"udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna=.b32.i2p\")"
                ;
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_c50 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c48 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)psVar6,(size_t)&local_c50,0xf9);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_c60 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c58 = "";
                local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
                local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
                file_54.m_end = (iterator)0xfc;
                file_54.m_begin = (iterator)&local_c60;
                msg_54.m_end = pvVar5;
                msg_54.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,
                           (size_t)&local_c70,msg_54);
                s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_80,"udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v",0x3c);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = 
                "!addr.SetSpecial(\"udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v\\0wtf.b32.i2p\"s)"
                ;
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_c80 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c78 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)psVar6,(size_t)&local_c80,0xfc);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_c90 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_c88 = "";
                local_ca0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
                file_55.m_end = (iterator)0x102;
                file_55.m_begin = (iterator)&local_c90;
                msg_55.m_end = pvVar5;
                msg_55.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,
                           (size_t)&local_ca0,msg_55);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,
                           "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.b32.i2p",
                           &local_879);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = 
                "!addr.SetSpecial(\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.b32.i2p\")"
                ;
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_cb0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ca8 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)psVar6,(size_t)&local_cb0,0x102);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                local_cc0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_cb8 = "";
                local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_cc8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_56.m_end = (iterator)0x105;
                file_56.m_begin = (iterator)&local_cc0;
                msg_56.m_end = pvVar5;
                msg_56.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,
                           (size_t)&local_cd0,msg_56);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,"tp*szydbh4dp.b32.i2p",&local_879);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = "!addr.SetSpecial(std::string{\"tp*szydbh4dp.b32.i2p\"})";
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                local_ce0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_cd8 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)psVar6,(size_t)&local_ce0,0x105);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,"esffpp",(allocator<char> *)local_e0);
                CNetAddr::SetInternal(&addr,(string *)local_80);
                std::__cxx11::string::~string((string *)local_80);
                local_cf0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_ce8 = "";
                local_d00 = &boost::unit_test::basic_cstring<char_const>::null;
                local_cf8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_57.m_end = (iterator)0x109;
                file_57.m_begin = (iterator)&local_cf0;
                msg_57.m_end = pvVar5;
                msg_57.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,
                           (size_t)&local_d00,msg_57);
                bVar2 = CNetAddr::IsValid(&addr);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "!addr.IsValid()";
                local_100._M_string_length = 0xbc4055;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_d10 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d08 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                local_e0[0] = (class_property<bool>)(class_property<bool>)!bVar2;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                           (check_type)psVar6,(size_t)&local_d10,0x109);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_d20 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d18 = "";
                local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
                local_d28 = &boost::unit_test::basic_cstring<char_const>::null;
                file_58.m_end = (iterator)0x10a;
                file_58.m_begin = (iterator)&local_d20;
                msg_58.m_end = pvVar5;
                msg_58.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,
                           (size_t)&local_d30,msg_58);
                local_e0[0] = (class_property<bool>)CNetAddr::IsInternal(&addr);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "addr.IsInternal()";
                local_100._M_string_length = 0xbc4679;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_d40 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d38 = "";
                pvVar4 = (iterator)0x2;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,2,0,WARN,
                           (check_type)psVar6,(size_t)&local_d40,0x10a);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_d50 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d48 = "";
                local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
                local_d58 = &boost::unit_test::basic_cstring<char_const>::null;
                file_59.m_end = (iterator)0x10c;
                file_59.m_begin = (iterator)&local_d50;
                msg_59.m_end = pvVar5;
                msg_59.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,
                           (size_t)&local_d60,msg_59);
                bVar2 = CNetAddr::IsBindAny(&addr);
                local_e0[0] = (class_property<bool>)!bVar2;
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "!addr.IsBindAny()";
                local_100._M_string_length = 0xbc407f;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_d70 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d68 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                           (check_type)psVar6,(size_t)&local_d70,0x10c);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_d80 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d78 = "";
                local_d90 = &boost::unit_test::basic_cstring<char_const>::null;
                local_d88 = &boost::unit_test::basic_cstring<char_const>::null;
                file_60.m_end = (iterator)0x10d;
                file_60.m_begin = (iterator)&local_d80;
                msg_60.m_end = pvVar5;
                msg_60.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,
                           (size_t)&local_d90,msg_60);
                local_e0[0] = (class_property<bool>)CNetAddr::IsAddrV1Compatible(&addr);
                local_e0._8_8_ = (element_type *)0x0;
                aStack_d0._M_allocated_capacity = 0;
                local_100._M_dataplus._M_p = "addr.IsAddrV1Compatible()";
                local_100._M_string_length = 0xbc41bd;
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011481f0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_da0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_d98 = "";
                pvVar4 = &DAT_00000001;
                pvVar5 = (iterator)0x0;
                local_70[1] = (undefined1 *)&local_100;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)local_e0,(lazy_ostream *)local_80,1,0,WARN,
                           (check_type)psVar6,(size_t)&local_da0,0x10d);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&aStack_d0._M_allocated_capacity);
                local_db0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_da8 = "";
                local_dc0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_db8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_61.m_end = (iterator)0x10e;
                file_61.m_begin = (iterator)&local_db0;
                msg_61.m_end = pvVar5;
                msg_61.m_begin = pvVar4;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,
                           (size_t)&local_dc0,msg_61);
                local_80[8] = 0;
                local_80._0_8_ = &PTR__lazy_ostream_011480b0;
                local_70[0] = boost::unit_test::lazy_ostream::inst;
                local_70[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
                local_dd0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_dc8 = "";
                CNetAddr::ToStringAddr_abi_cxx11_((string *)local_e0,&addr);
                pcVar9 = "esffpvrt3wpeaygy.internal";
                pvVar5 = (iterator)0x2;
                pvVar4 = local_e0;
                boost::test_tools::tt_detail::
                check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[26]>
                          (local_80,&local_dd0,0x10e,1,2,pvVar4,0xbc8945,"esffpvrt3wpeaygy.internal"
                           ,"\"esffpvrt3wpeaygy.internal\"");
                std::__cxx11::string::~string((string *)local_e0);
                local_de0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp"
                ;
                local_dd8 = "";
                local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_de8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_62.m_end = (iterator)0x111;
                file_62.m_begin = (iterator)&local_de0;
                msg_62.m_end = pvVar4;
                msg_62.m_begin = pvVar5;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,
                           (size_t)&local_df0,msg_62);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)local_80,"totally bogus",&local_879);
                bVar2 = CNetAddr::SetSpecial(&addr,(string *)local_80);
                local_100._M_dataplus._M_p._0_1_ = !bVar2;
                local_100._M_string_length = 0;
                local_100.field_2._M_allocated_capacity = 0;
                local_840 = "!addr.SetSpecial(\"totally bogus\")";
                local_838 = "";
                local_e0._8_8_ = local_e0._8_8_ & 0xffffffffffffff00;
                local_e0._0_8_ = &PTR__lazy_ostream_011481f0;
                aStack_d0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
                aStack_d0._8_8_ = &local_840;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_100,(lazy_ostream *)local_e0,1,0,WARN,
                           (check_type)pcVar9,(size_t)&stack0xfffffffffffff200,0x111);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)&local_100.field_2._M_allocated_capacity);
                std::__cxx11::string::~string((string *)local_80);
                std::__cxx11::string::~string((string *)&scoped_addr);
                std::__cxx11::string::~string((string *)&link_local);
                prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&addr.m_addr);
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                  return;
                }
              }
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_basic)
{
    CNetAddr addr;

    // IPv4, INADDR_ANY
    addr = LookupHost("0.0.0.0", false).value();
    BOOST_REQUIRE(!addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv4());

    BOOST_CHECK(addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "0.0.0.0");

    // IPv4, INADDR_NONE
    addr = LookupHost("255.255.255.255", false).value();
    BOOST_REQUIRE(!addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv4());

    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "255.255.255.255");

    // IPv4, casual
    addr = LookupHost("12.34.56.78", false).value();
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv4());

    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "12.34.56.78");

    // IPv6, in6addr_any
    addr = LookupHost("::", false).value();
    BOOST_REQUIRE(!addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv6());

    BOOST_CHECK(addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "::");

    // IPv6, casual
    addr = LookupHost("1122:3344:5566:7788:9900:aabb:ccdd:eeff", false).value();
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv6());

    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "1122:3344:5566:7788:9900:aabb:ccdd:eeff");

    // IPv6, scoped/link-local. See https://tools.ietf.org/html/rfc4007
    // We support non-negative decimal integers (uint32_t) as zone id indices.
    // Normal link-local scoped address functionality is to append "%" plus the
    // zone id, for example, given a link-local address of "fe80::1" and a zone
    // id of "32", return the address as "fe80::1%32".
    const std::string link_local{"fe80::1"};
    const std::string scoped_addr{link_local + "%32"};
    addr = LookupHost(scoped_addr, false).value();
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv6());
    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), scoped_addr);

    // Test that the delimiter "%" and default zone id of 0 can be omitted for the default scope.
    addr = LookupHost(link_local + "%0", false).value();
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsIPv6());
    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), link_local);

    // TORv2, no longer supported
    BOOST_CHECK(!addr.SetSpecial("6hzph5hv6337r6p2.onion"));

    // TORv3
    const char* torv3_addr = "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion";
    BOOST_REQUIRE(addr.SetSpecial(torv3_addr));
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsTor());

    BOOST_CHECK(!addr.IsI2P());
    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), torv3_addr);

    // TORv3, broken, with wrong checksum
    BOOST_CHECK(!addr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.onion"));

    // TORv3, broken, with wrong version
    BOOST_CHECK(!addr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscrye.onion"));

    // TORv3, malicious
    BOOST_CHECK(!addr.SetSpecial(std::string{
        "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd\0wtf.onion", 66}));

    // TOR, bogus length
    BOOST_CHECK(!addr.SetSpecial(std::string{"mfrggzak.onion"}));

    // TOR, invalid base32
    BOOST_CHECK(!addr.SetSpecial(std::string{"mf*g zak.onion"}));

    // I2P
    const char* i2p_addr = "UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P";
    BOOST_REQUIRE(addr.SetSpecial(i2p_addr));
    BOOST_REQUIRE(addr.IsValid());
    BOOST_REQUIRE(addr.IsI2P());

    BOOST_CHECK(!addr.IsTor());
    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), ToLower(i2p_addr));

    // I2P, correct length, but decodes to less than the expected number of bytes.
    BOOST_CHECK(!addr.SetSpecial("udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jn=.b32.i2p"));

    // I2P, extra unnecessary padding
    BOOST_CHECK(!addr.SetSpecial("udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna=.b32.i2p"));

    // I2P, malicious
    BOOST_CHECK(!addr.SetSpecial("udhdrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v\0wtf.b32.i2p"s));

    // I2P, valid but unsupported (56 Base32 characters)
    // See "Encrypted LS with Base 32 Addresses" in
    // https://geti2p.net/spec/encryptedleaseset.txt
    BOOST_CHECK(
        !addr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscsad.b32.i2p"));

    // I2P, invalid base32
    BOOST_CHECK(!addr.SetSpecial(std::string{"tp*szydbh4dp.b32.i2p"}));

    // Internal
    addr.SetInternal("esffpp");
    BOOST_REQUIRE(!addr.IsValid()); // "internal" is considered invalid
    BOOST_REQUIRE(addr.IsInternal());

    BOOST_CHECK(!addr.IsBindAny());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "esffpvrt3wpeaygy.internal");

    // Totally bogus
    BOOST_CHECK(!addr.SetSpecial("totally bogus"));
}